

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigcache.cpp
# Opt level: O0

void __thiscall
SignatureCache::ComputeEntryECDSA
          (SignatureCache *this,uint256 *entry,uint256 *hash,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSig,CPubKey *pubkey)

{
  long lVar1;
  CSHA256 *this_00;
  CSHA256 *hash_00;
  CSHA256 *this_01;
  CSHA256 *in_RCX;
  uchar *in_R8;
  long in_FS_OFFSET;
  CSHA256 hasher;
  base_blob<256U> *in_stack_ffffffffffffff38;
  size_t in_stack_ffffffffffffff58;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  base_blob<256U>::begin(in_stack_ffffffffffffff38);
  this_00 = CSHA256::Write(in_RCX,in_R8,in_stack_ffffffffffffff58);
  CPubKey::data((CPubKey *)this_00);
  CPubKey::size((CPubKey *)this_00);
  hash_00 = CSHA256::Write(in_RCX,in_R8,in_stack_ffffffffffffff58);
  this_01 = (CSHA256 *)
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  CSHA256::Write(in_RCX,in_R8,in_stack_ffffffffffffff58);
  base_blob<256U>::begin((base_blob<256U> *)this_00);
  CSHA256::Finalize(this_01,(uchar *)hash_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SignatureCache::ComputeEntryECDSA(uint256& entry, const uint256& hash, const std::vector<unsigned char>& vchSig, const CPubKey& pubkey) const
{
    CSHA256 hasher = m_salted_hasher_ecdsa;
    hasher.Write(hash.begin(), 32).Write(pubkey.data(), pubkey.size()).Write(vchSig.data(), vchSig.size()).Finalize(entry.begin());
}